

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O0

AnyTrueMatcher * Catch::Matchers::AnyTrue(void)

{
  AnyTrueMatcher *in_RDI;
  
  memset(in_RDI,0,0x28);
  AnyTrueMatcher::AnyTrueMatcher(in_RDI);
  return in_RDI;
}

Assistant:

AnyTrueMatcher AnyTrue() { return AnyTrueMatcher{}; }